

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O3

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,false>::
card_did_change_interrupt_flags
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,false> *this)

{
  Card *in_RSI;
  
  ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_false>::
  card_did_change_interrupt_flags
            ((ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_false> *)(this + -0x108),
             in_RSI);
  return;
}

Assistant:

void card_did_change_interrupt_flags(Apple::II::Card *) final {
			bool nmi = false;
			bool irq = false;

			for(const auto &card: cards_) {
				if(card) {
					nmi |= card->nmi();
					irq |= card->irq();
				}
			}
			m6502_.set_nmi_line(nmi);
			m6502_.set_irq_line(irq);
		}